

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O0

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_leave_cluster_req(raft_server *this,req_msg *req)

{
  bool bVar1;
  int iVar2;
  char *__addr_len;
  element_type *peVar3;
  element_type *this_00;
  element_type *peVar4;
  msg_base *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  ptr<nuraft::resp_msg> pVar6;
  ptr<resp_msg> pVar7;
  ptr<resp_msg> *resp;
  int *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  msg_type *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  string local_60 [48];
  int32 local_30;
  undefined4 local_2c;
  ulong local_28;
  undefined1 local_19;
  msg_base *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x27912d);
  local_28 = srv_state::get_term((srv_state *)0x279135);
  local_2c = 0xf;
  __addr_len = (char *)(in_RSI + 0x38);
  local_30 = msg_base::get_src(local_18);
  pVar6 = cs_new<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int>
                    ((unsigned_long *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  _Var5 = pVar6.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((*(byte *)(in_RSI + 0xe9) & 1) == 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2791c5);
      iVar2 = (*peVar3->_vptr_logger[7])();
      if (4 < iVar2) {
        peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2791f5);
        msg_if_given_abi_cxx11_((char *)local_60,"leave cluster, set steps to down to 2");
        __addr_len = "handle_leave_cluster_req";
        (*peVar3->_vptr_logger[8])
                  (peVar3,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_leave_cluster_req",0x1c5,local_60);
        std::__cxx11::string::~string(local_60);
      }
    }
    *(undefined4 *)(in_RSI + 0x14c) = 2;
    this_00 = std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x27928f);
    peVar4 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2792a5);
    iVar2 = (*peVar4->_vptr_log_store[2])();
    resp_msg::accept(this_00,iVar2,__addr,(socklen_t *)__addr_len);
    _Var5._M_pi = extraout_RDX;
  }
  pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_leave_cluster_req(req_msg& req) {
    ptr<resp_msg> resp
        ( cs_new<resp_msg>( state_->get_term(),
                            msg_type::leave_cluster_response,
                            id_,
                            req.get_src() ) );
    if (!config_changing_) {
        p_db("leave cluster, set steps to down to 2");
        // NOTE: We don't call `RemovedFromCluster` callback here,
        //       as cluster config still contains this server.
        //       The callback will be called by either `reconfigure()` (normal path)
        //       or `handle_prevote_resp()` (otherwise).
        //
        //       If this leave cluster message cannot reach quorum,
        //       the new leader's config log (containing this server) will clear
        //       `steps_to_down_` to 0.
        steps_to_down_ = 2;
        resp->accept(log_store_->next_slot());
    }

    return resp;
}